

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O2

void WebRtc_rdft(size_t n,int isgn,float *a,size_t *ip,float *w)

{
  ulong uVar1;
  long lVar2;
  float *pfVar3;
  size_t n_00;
  long lVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  size_t local_48;
  
  n_00 = *ip;
  if (n_00 * 4 < n) {
    n_00 = n >> 2;
    *ip = n_00;
    ip[1] = 1;
    if (0xb < n) {
      uVar5 = n >> 3;
      fVar8 = 0.7853982 / (float)uVar5;
      w[0] = 1.0;
      w[1] = 0.0;
      fVar6 = cosf((float)uVar5 * fVar8);
      w[uVar5] = fVar6;
      w[uVar5 + 1] = fVar6;
      if (0x17 < n) {
        pfVar3 = w + (n_00 - 1);
        for (uVar1 = 2; uVar1 < uVar5; uVar1 = uVar1 + 2) {
          fVar6 = (float)(long)uVar1 * fVar8;
          fVar7 = cosf(fVar6);
          fVar6 = sinf(fVar6);
          w[uVar1] = fVar7;
          w[uVar1 + 1] = fVar6;
          pfVar3[-1] = fVar6;
          *pfVar3 = fVar7;
          pfVar3 = pfVar3 + -2;
        }
        bitrv2(n_00,ip + 2,w);
      }
    }
  }
  local_48 = ip[1];
  if (local_48 * 4 < n) {
    local_48 = n >> 2;
    ip[1] = local_48;
    if (7 < n) {
      uVar1 = n >> 3;
      fVar8 = 0.7853982 / (float)uVar1;
      fVar6 = cosf((float)uVar1 * fVar8);
      w[n_00] = fVar6;
      w[n_00 + uVar1] = fVar6 * 0.5;
      pfVar3 = w + n_00 + (local_48 - 1);
      for (uVar5 = 1; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        fVar6 = (float)(long)uVar5 * fVar8;
        fVar7 = cosf(fVar6);
        w[n_00 + uVar5] = fVar7 * 0.5;
        fVar6 = sinf(fVar6);
        *pfVar3 = fVar6 * 0.5;
        pfVar3 = pfVar3 + -1;
      }
    }
  }
  if (isgn < 0) {
    fVar6 = (*a - a[1]) * 0.5;
    a[1] = fVar6;
    *a = *a - fVar6;
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
        return;
      }
    }
    else {
      a[1] = -fVar6;
      uVar1 = n >> 1;
      lVar4 = 0;
      lVar2 = n - 2;
      for (uVar5 = 2; uVar5 < uVar1; uVar5 = uVar5 + 2) {
        lVar4 = lVar4 + (local_48 * 2) / uVar1;
        fVar6 = (float)*(undefined8 *)(a + uVar5);
        fVar9 = (float)((ulong)*(undefined8 *)(a + uVar5) >> 0x20);
        fVar15 = fVar6 - (float)*(undefined8 *)(a + lVar2);
        fVar7 = (float)((ulong)*(undefined8 *)(a + lVar2) >> 0x20) + fVar9;
        fVar8 = (0.5 - w[n_00 + (local_48 - lVar4)]) * fVar15 + fVar7 * w[n_00 + lVar4];
        fVar7 = (0.5 - w[n_00 + (local_48 - lVar4)]) * fVar7 + fVar15 * -w[n_00 + lVar4];
        *(ulong *)(a + uVar5) = CONCAT44(fVar7 - fVar9,fVar6 - fVar8);
        *(ulong *)(a + lVar2) =
             CONCAT44(fVar7 - (float)((ulong)*(undefined8 *)(a + lVar2) >> 0x20),
                      fVar8 + (float)*(undefined8 *)(a + lVar2));
        lVar2 = lVar2 + -2;
      }
      a[uVar1 + 1] = -a[uVar1 + 1];
      bitrv2(n,ip + 2,a);
      if (n < 9) {
        uVar5 = 2;
      }
      else {
        cft1st(n,a,w);
        uVar5 = 8;
        while (uVar5 * 4 < n) {
          cftmdl(n,uVar5,a,w);
          uVar5 = uVar5 * 4;
        }
      }
      if (uVar5 * 4 - n == 0) {
        for (uVar1 = 0; uVar1 < uVar5; uVar1 = uVar1 + 2) {
          fVar9 = -a[1] - a[uVar5 + 1];
          fVar7 = *a + a[uVar5];
          fVar6 = a[uVar5 + 1] - a[1];
          fVar8 = *a - a[uVar5];
          fVar15 = (float)*(undefined8 *)(a + uVar5 * 2);
          fVar10 = (float)((ulong)*(undefined8 *)(a + uVar5 * 2) >> 0x20);
          fVar11 = (float)*(undefined8 *)(a + uVar5 * 3);
          fVar13 = fVar15 + fVar11;
          fVar12 = (float)((ulong)*(undefined8 *)(a + uVar5 * 3) >> 0x20);
          fVar14 = fVar10 + fVar12;
          fVar15 = fVar15 - fVar11;
          fVar10 = fVar10 - fVar12;
          *a = fVar7 + fVar13;
          a[1] = fVar9 - fVar14;
          a[uVar5 * 2] = fVar7 - fVar13;
          a[uVar5 * 2 + 1] = fVar14 + fVar9;
          *(ulong *)(a + uVar5) = CONCAT44(fVar6 - fVar15,fVar8 - fVar10);
          *(ulong *)(a + uVar5 * 3) = CONCAT44(fVar15 + fVar6,fVar10 + fVar8);
          a = a + 2;
        }
      }
      else {
        for (uVar1 = 0; uVar1 < uVar5; uVar1 = uVar1 + 2) {
          fVar6 = a[uVar1];
          fVar8 = a[uVar5 + uVar1];
          fVar7 = a[uVar5 + uVar1 + 1];
          a[uVar1] = fVar6 + fVar8;
          fVar9 = a[uVar1 + 1];
          a[uVar1 + 1] = -fVar9 - a[uVar5 + uVar1 + 1];
          *(ulong *)(a + uVar5 + uVar1) = CONCAT44(fVar7 - fVar9,fVar6 - fVar8);
        }
      }
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      lVar2 = 0;
      lVar4 = n - 2;
      for (uVar5 = 2; uVar5 < n >> 1; uVar5 = uVar5 + 2) {
        lVar2 = lVar2 + (local_48 * 2) / (n >> 1);
        fVar7 = (float)*(undefined8 *)(a + uVar5);
        fVar9 = (float)((ulong)*(undefined8 *)(a + uVar5) >> 0x20);
        fVar15 = fVar7 - (float)*(undefined8 *)(a + lVar4);
        fVar8 = (float)((ulong)*(undefined8 *)(a + lVar4) >> 0x20) + fVar9;
        fVar6 = (0.5 - w[n_00 + (local_48 - lVar2)]) * fVar15 + -w[n_00 + lVar2] * fVar8;
        fVar8 = (0.5 - w[n_00 + (local_48 - lVar2)]) * fVar8 + w[n_00 + lVar2] * fVar15;
        *(ulong *)(a + uVar5) = CONCAT44(fVar9 - fVar8,fVar7 - fVar6);
        *(ulong *)(a + lVar4) =
             CONCAT44((float)((ulong)*(undefined8 *)(a + lVar4) >> 0x20) - fVar8,
                      (float)*(undefined8 *)(a + lVar4) + fVar6);
        lVar4 = lVar4 + -2;
      }
    }
    fVar6 = *a;
    *a = fVar6 + a[1];
    a[1] = fVar6 - a[1];
  }
  return;
}

Assistant:

void WebRtc_rdft(size_t n, int isgn, float *a, size_t *ip, float *w) {
    size_t nw, nc;
    float xi;

    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 2)) {
        nc = n >> 2;
        makect(nc, ip, w + nw);
    }
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xi = a[0] - a[1];
        a[0] += a[1];
        a[1] = xi;
    } else {
        a[1] = 0.5f * (a[0] - a[1]);
        a[0] -= a[1];
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
}